

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

CFGNode * __thiscall
dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches
          (CFGStructurizer *this,CFGNode *node,CFGNode *must_reach,CFGNode *must_reach_frontier)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  pointer ppCVar4;
  CFGNode *pCVar5;
  long lVar6;
  undefined8 *puVar7;
  CFGStructurizer *pCVar8;
  bool bVar9;
  ulong uVar10;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  _Var11;
  _Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *p_Var12;
  pointer ppCVar13;
  _Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *p_Var14;
  CFGNode *pCVar15;
  long lVar16;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  __i;
  Vector<CFGNode_*> frontiers;
  CFGNode *frontier;
  CFGNode *pdoms;
  UnorderedSet<const_CFGNode_*> promoted_post_dominators;
  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> local_b8;
  CFGNode *local_a0;
  CFGNode *local_98;
  CFGNode *local_90;
  CFGNode *local_88;
  CFGStructurizer *local_80;
  CFGNode *local_78;
  CFGNode *local_70;
  _Alloc_hider local_68;
  size_type local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  void *local_40;
  pointer pPStack_38;
  
  local_68._M_p = (pointer)&stack0xffffffffffffffc8;
  local_60 = 1;
  local_58 = (undefined8 *)0x0;
  uStack_50 = 0;
  local_48 = 1.0;
  local_40 = (void *)0x0;
  pPStack_38 = (pointer)0x0;
  local_b8.
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&stack0xffffffffffffff98;
  local_70 = node;
  std::
  _Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<dxil_spv::CFGNode_const*const&,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<dxil_spv::CFGNode_const*,false>>>>
            ((_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_b8.
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start,&local_70);
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            (&local_b8,&local_70->post_dominance_frontier);
  if ((local_70 != must_reach) &&
     (((this->reachability_bitset).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start
       [(ulong)(this->reachability_stride * local_70->forward_post_visit_order) +
        (ulong)(must_reach->forward_post_visit_order >> 5)] >>
       (must_reach->forward_post_visit_order & 0x1f) & 1) == 0)) {
    __assert_fail("query_reachability(*node, *must_reach)",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x1b48,
                  "CFGNode *dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(const CFGNode *, const CFGNode *, const CFGNode *) const"
                 );
  }
  pCVar15 = must_reach_frontier;
  pCVar5 = must_reach;
  pCVar8 = this;
  if (local_b8.
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_b8.
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
LAB_0014261b:
    local_a0 = (CFGNode *)0x0;
  }
  else {
    do {
      local_80 = pCVar8;
      local_88 = pCVar5;
      local_98 = pCVar15;
      ppCVar13 = local_b8.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (local_b8.
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_b8.
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00142606:
        if (local_b8.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_b8.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0014261b;
        local_a0 = *local_b8.
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        break;
      }
      if (local_98 != (CFGNode *)0x0) {
        lVar16 = (long)local_b8.
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_b8.
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        p_Var14 = (_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)local_b8.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        if (0 < lVar16) {
          p_Var14 = (_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     *)((long)local_b8.
                              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                       ((long)local_b8.
                              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_b8.
                              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffe0));
          uVar1 = this->reachability_stride;
          puVar3 = (this->reachability_bitset).
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          lVar16 = lVar16 + 1;
          p_Var12 = (_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     *)((long)local_b8.
                              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0x10);
          do {
            if ((*(CFGNode **)(p_Var12 + -0x10) != local_98) &&
               (uVar2 = (*(CFGNode **)(p_Var12 + -0x10))->forward_post_visit_order,
               (puVar3[(ulong)(local_98->forward_post_visit_order * uVar1) + (ulong)(uVar2 >> 5)] >>
                (uVar2 & 0x1f) & 1) == 0)) {
              p_Var12 = p_Var12 + -0x10;
              goto LAB_00142364;
            }
            if ((*(CFGNode **)(p_Var12 + -8) != local_98) &&
               (uVar2 = (*(CFGNode **)(p_Var12 + -8))->forward_post_visit_order,
               (puVar3[(ulong)(local_98->forward_post_visit_order * uVar1) + (ulong)(uVar2 >> 5)] >>
                (uVar2 & 0x1f) & 1) == 0)) {
              p_Var12 = p_Var12 + -8;
              goto LAB_00142364;
            }
            if ((*(CFGNode **)p_Var12 != local_98) &&
               (uVar2 = (*(CFGNode **)p_Var12)->forward_post_visit_order,
               (puVar3[(ulong)(local_98->forward_post_visit_order * uVar1) + (ulong)(uVar2 >> 5)] >>
                (uVar2 & 0x1f) & 1) == 0)) goto LAB_00142364;
            if ((*(CFGNode **)(p_Var12 + 8) != local_98) &&
               (uVar2 = (*(CFGNode **)(p_Var12 + 8))->forward_post_visit_order,
               (puVar3[(ulong)(local_98->forward_post_visit_order * uVar1) + (ulong)(uVar2 >> 5)] >>
                (uVar2 & 0x1f) & 1) == 0)) {
              p_Var12 = p_Var12 + 8;
              goto LAB_00142364;
            }
            lVar16 = lVar16 + -1;
            p_Var12 = p_Var12 + 0x20;
          } while (1 < lVar16);
        }
        lVar16 = (long)local_b8.
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var14 >> 3;
        if (lVar16 == 1) {
LAB_0014231b:
          p_Var12 = (_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     *)local_b8.
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          if ((*(CFGNode **)p_Var14 != local_98) &&
             (uVar1 = (*(CFGNode **)p_Var14)->forward_post_visit_order, p_Var12 = p_Var14,
             ((this->reachability_bitset).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start
              [(ulong)(this->reachability_stride * local_98->forward_post_visit_order) +
               (ulong)(uVar1 >> 5)] >> (uVar1 & 0x1f) & 1) != 0)) {
            p_Var12 = (_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       *)local_b8.
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        else if (lVar16 == 2) {
LAB_001422e8:
          if ((*(CFGNode **)p_Var14 == local_98) ||
             (uVar1 = (*(CFGNode **)p_Var14)->forward_post_visit_order, p_Var12 = p_Var14,
             ((this->reachability_bitset).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start
              [(ulong)(this->reachability_stride * local_98->forward_post_visit_order) +
               (ulong)(uVar1 >> 5)] >> (uVar1 & 0x1f) & 1) != 0)) {
            p_Var14 = p_Var14 + 8;
            goto LAB_0014231b;
          }
        }
        else {
          p_Var12 = (_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     *)local_b8.
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          if ((lVar16 == 3) &&
             ((*(CFGNode **)p_Var14 == local_98 ||
              (uVar1 = (*(CFGNode **)p_Var14)->forward_post_visit_order, p_Var12 = p_Var14,
              ((this->reachability_bitset).
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start
               [(ulong)(this->reachability_stride * local_98->forward_post_visit_order) +
                (ulong)(uVar1 >> 5)] >> (uVar1 & 0x1f) & 1) != 0)))) {
            p_Var14 = p_Var14 + 8;
            goto LAB_001422e8;
          }
        }
LAB_00142364:
        if ((p_Var12 !=
             (_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_b8.
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) &&
           (p_Var14 = p_Var12 + 8,
           p_Var14 !=
           (_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            *)local_b8.
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish)) {
          uVar1 = this->reachability_stride;
          do {
            pCVar15 = *(CFGNode **)p_Var14;
            if ((pCVar15 == local_98) ||
               (((this->reachability_bitset).
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(ulong)(local_98->forward_post_visit_order * uVar1) +
                  (ulong)(pCVar15->forward_post_visit_order >> 5)] >>
                 (pCVar15->forward_post_visit_order & 0x1f) & 1) != 0)) {
              *(CFGNode **)p_Var12 = pCVar15;
              p_Var12 = p_Var12 + 8;
            }
            p_Var14 = p_Var14 + 8;
          } while (p_Var14 !=
                   (_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_b8.
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((p_Var12 !=
             (_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_b8.
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) &&
           ((_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)local_b8.
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish != p_Var12)) {
          local_b8.
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var12;
        }
      }
      ppCVar4 = local_b8.
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar16 = (long)local_b8.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_b8.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = lVar16 >> 3;
      if (uVar10 < 2) {
        if (local_b8.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_b8.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00142606;
      }
      else {
        if (local_b8.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_b8.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          lVar6 = 0x3f;
          if (uVar10 != 0) {
            for (; uVar10 >> lVar6 == 0; lVar6 = lVar6 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__1>>
                    (local_b8.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_b8.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar16 < 0x81) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__1>>
                      (ppCVar13,ppCVar4);
          }
          else {
            p_Var14 = (_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       *)((long)ppCVar13 + 0x80);
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)const::__1>>
                      (ppCVar13,p_Var14);
            for (; p_Var14 !=
                   (_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)ppCVar4; p_Var14 = p_Var14 + 8) {
              lVar16 = *(long *)(p_Var14 + -8);
              lVar6 = *(long *)p_Var14;
              uVar2 = *(uint *)(lVar6 + 0xcc);
              uVar1 = *(uint *)(lVar16 + 0xcc);
              p_Var12 = p_Var14;
              while (uVar2 < uVar1) {
                *(long *)p_Var12 = lVar16;
                lVar16 = *(long *)(p_Var12 + -0x10);
                p_Var12 = p_Var12 + -8;
                uVar1 = *(uint *)(lVar16 + 0xcc);
              }
              *(long *)p_Var12 = lVar6;
            }
          }
        }
        _Var11 = std::
                 __unique<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                           (local_b8.
                            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            local_b8.
                            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
        if ((_Var11._M_current !=
             local_b8.
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (local_b8.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != _Var11._M_current)) {
          local_b8.
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Var11;
        }
      }
      local_90 = *(CFGNode **)
                  ((long)local_b8.
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -8);
      ppCVar4 = (local_90->succ).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pCVar15 = local_88;
      for (ppCVar13 = (local_90->succ).
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; bVar9 = true, ppCVar13 != ppCVar4;
          ppCVar13 = ppCVar13 + 1) {
        pCVar5 = *ppCVar13;
        puVar7 = (undefined8 *)local_58;
        if ((pCVar5 == pCVar15) ||
           (((local_80->reachability_bitset).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start
             [(ulong)(local_80->reachability_stride * pCVar5->forward_post_visit_order) +
              (ulong)(pCVar15->forward_post_visit_order >> 5)] >>
             (pCVar15->forward_post_visit_order & 0x1f) & 1) != 0)) {
          for (; bVar9 = false, puVar7 != (undefined8 *)0x0; puVar7 = (undefined8 *)*puVar7) {
            bVar9 = CFGNode::post_dominates((CFGNode *)puVar7[1],pCVar5);
            pCVar15 = local_88;
            if (bVar9) {
              bVar9 = true;
              break;
            }
          }
        }
        else {
          bVar9 = true;
        }
        if (!bVar9) {
          bVar9 = false;
          break;
        }
      }
      this = local_80;
      if (bVar9) {
        local_78 = (CFGNode *)&stack0xffffffffffffff98;
        std::
        _Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<dxil_spv::CFGNode_const*const&,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<dxil_spv::CFGNode_const*,false>>>>
                  ((_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_78,&local_90,&local_78);
        local_b8.
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_b8.
                             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -8);
        ppCVar4 = (local_90->post_dominance_frontier).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppCVar13 = (local_90->post_dominance_frontier).
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppCVar13 != ppCVar4;
            ppCVar13 = ppCVar13 + 1) {
          local_78 = *ppCVar13;
          if (local_b8.
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_b8.
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
            _M_realloc_insert<dxil_spv::CFGNode*const&>
                      ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
                        *)&local_b8,
                       (iterator)
                       local_b8.
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_78);
          }
          else {
            *local_b8.
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = local_78;
            local_b8.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_b8.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      else {
        local_a0 = local_90;
      }
      pCVar15 = local_98;
      pCVar5 = local_88;
      pCVar8 = local_80;
    } while (bVar9);
  }
  if ((_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
       *)local_b8.
         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
         ._M_impl.super__Vector_impl_data._M_start !=
      (_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
       *)0x0) {
    free_in_thread(local_b8.
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&stack0xffffffffffffff98);
  return local_a0;
}

Assistant:

CFGNode *CFGStructurizer::get_post_dominance_frontier_with_cfg_subset_that_reaches(const CFGNode *node,
                                                                                   const CFGNode *must_reach,
                                                                                   const CFGNode *must_reach_frontier) const
{
	UnorderedSet<const CFGNode *> promoted_post_dominators;
	promoted_post_dominators.insert(node);
	auto frontiers = node->post_dominance_frontier;

	assert(query_reachability(*node, *must_reach));

	if (frontiers.empty())
		return nullptr;

	while (!frontiers.empty())
	{
		// We might not be interested in post-domination-frontiers that we cannot reach.
		// Filter our search based on this.
		if (must_reach_frontier)
		{
			auto itr = std::remove_if(frontiers.begin(), frontiers.end(), [&](CFGNode *candidate) {
			    return !query_reachability(*must_reach_frontier, *candidate);
			});
			frontiers.erase(itr, frontiers.end());
		}

		if (frontiers.size() > 1)
		{
			std::sort(frontiers.begin(), frontiers.end(), [](const CFGNode *a, const CFGNode *b) {
				return a->backward_post_visit_order < b->backward_post_visit_order;
			});
			frontiers.erase(std::unique(frontiers.begin(), frontiers.end()), frontiers.end());
		}
		else if (frontiers.empty())
			break;

		auto *frontier = frontiers.back();

		// For a frontier to be discounted, we look at all successors and check
		// if there no node in promoted_post_dominators that post-dominate the successor, that path cannot reach must_reach.
		// If a post dominance frontier satisfies this rule, it is promoted to be considered an alias of node.

		bool all_succs_must_go_via_node = true;
		for (auto *succ : frontier->succ)
		{
			bool promote = true;
			if (query_reachability(*succ, *must_reach))
			{
				promote = false;
				for (auto *pdom : promoted_post_dominators)
				{
					if (pdom->post_dominates(succ))
					{
						promote = true;
						break;
					}
				}
			}

			if (!promote)
			{
				all_succs_must_go_via_node = false;
				break;
			}
		}

		if (!all_succs_must_go_via_node)
		{
			return frontier;
		}
		else
		{
			promoted_post_dominators.insert(frontier);
			frontiers.pop_back();
			for (auto *pdoms : frontier->post_dominance_frontier)
				frontiers.push_back(pdoms);
		}
	}

	return frontiers.empty() ? nullptr : frontiers.front();
}